

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O1

bool flecs::_::pack_args_to_string<Position,Rocket>(world_t *world,stringstream *str,bool is_each)

{
  char *__s;
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  ostream *poVar4;
  long lVar5;
  array<const_char_*,_2UL> ids;
  char *local_40 [2];
  
  local_40[0] = component_info<Position>::name(world);
  local_40[1] = component_info<Rocket>::name(world);
  poVar4 = (ostream *)(str + 0x10);
  lVar5 = 0;
  do {
    __s = *(char **)((long)local_40 + lVar5);
    if (lVar5 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
    }
    pcVar1 = *(char **)((long)&DAT_00153d88 + lVar5);
    iVar2 = (int)poVar4;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar1,sVar3);
    }
    pcVar1 = *(char **)((long)&DAT_00153d88 + lVar5);
    if (pcVar1 == (char *)0x0) {
      std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar3 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar1,sVar3);
    }
    if (is_each) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"ANY:",4);
    }
    if (__s == (char *)0x0) {
      std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s,sVar3);
    }
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x10);
  return true;
}

Assistant:

bool pack_args_to_string(world_t *world, std::stringstream& str, bool is_each) {
    (void)world;

    std::array<const char*, sizeof...(Components)> ids = {
        (_::component_info<Components>::name(world))...
    };

    std::array<const char*, sizeof...(Components)> inout_modifiers = {
        (inout_modifier<Components>())...
    }; 

    std::array<const char*, sizeof...(Components)> optional_modifiers = {
        (optional_modifier<Components>())...
    };        

    size_t i = 0;
    for (auto id : ids) {
        if (i) {
            str << ",";
        }
        
        str << inout_modifiers[i];
        str << optional_modifiers[i];

        if (is_each) {
            str << "ANY:";
        }
        str << id;
        i ++;
    }  

    return i != 0;
}